

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O2

file_id * idx2::ConstructFilePath(file_id *__return_storage_ptr__,idx2_file *Idx2,u64 BrickAddress)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(Idx2->BricksPerFile).Arr[BrickAddress >> 0x3c];
  lVar1 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  bVar2 = -(uVar3 == 0) | (byte)lVar1;
  ConstructFilePath(__return_storage_ptr__,Idx2,
                    (BrickAddress >> 0x12 & 0x3ffffffffff) <<
                    ((1L << (bVar2 & 0x3f) != uVar3) + bVar2 & 0x3f),(byte)(BrickAddress >> 0x3c),
                    '\0',0);
  return __return_storage_ptr__;
}

Assistant:

v3i
GetSpatialBrick(const idx2_file& Idx2, int Level, u64 LinearBrick)
{
  int Size = Idx2.BricksOrderStr[Level].Len;
  v3i Brick3(0);
  for (int I = 0; I < Size; ++I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    int J = Size - I - 1;
    Brick3[D] |= (LinearBrick & (u64(1) << J)) >> J;
    Brick3[D] <<= 1;
  }
  return Brick3 >> 1;
}